

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

Vector3d * __thiscall OpenMD::Thermo::getComVel(Vector3d *__return_storage_ptr__,Thermo *this)

{
  Snapshot *this_00;
  Molecule *this_01;
  int extraout_EDX;
  int __denom;
  int extraout_EDX_00;
  MoleculeIterator *pMVar1;
  RealType s;
  MoleculeIterator i;
  Vector3d comVel;
  MoleculeIterator local_80;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasCOMvel == false) {
    local_80._M_node = (_Base_ptr)0x0;
    local_60.data_[0] = 0.0;
    Vector<double,_3U>::Vector(&local_48,local_60.data_);
    Vector<double,_3U>::Vector(&local_78,&local_48);
    pMVar1 = &local_80;
    this_01 = SimInfo::beginMolecule(this->info_,&local_80);
    __denom = extraout_EDX;
    while (this_01 != (Molecule *)0x0) {
      s = Molecule::getMass(this_01);
      Molecule::getComVel((Vector3d *)&local_60,this_01);
      operator*(&local_48,s,&local_60);
      Vector<double,_3U>::add(&local_78,&local_48);
      pMVar1 = &local_80;
      this_01 = SimInfo::nextMolecule(this->info_,&local_80);
      __denom = extraout_EDX_00;
    }
    Vector<double,_3U>::div(&local_78,(int)pMVar1,__denom);
    Snapshot::setCOMvel(this_00,(Vector3d *)&local_78);
  }
  Snapshot::getCOMvel(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Thermo::getComVel() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasCOMvel) {
      SimInfo::MoleculeIterator i;
      Molecule* mol;

      Vector3d comVel(0.0);
      RealType totalMass(0.0);

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        RealType mass = mol->getMass();
        totalMass += mass;
        comVel += mass * mol->getComVel();
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &totalMass, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, comVel.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      comVel /= totalMass;
      snap->setCOMvel(comVel);
    }
    return snap->getCOMvel();
  }